

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_Shift(ShiftForm1 Shift)

{
  uint uVar1;
  uint uVar2;
  uint8_t value;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qb;
  Image output;
  Image input;
  ImageTemplate<unsigned_char> local_80;
  Image local_58;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_58,value,0,0,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  uVar1 = (local_58._width >> 2) * 2;
  if (uVar1 < 2) {
    uVar1 = 1;
  }
  iVar4 = rand();
  iVar5 = rand();
  auVar7._0_8_ = (double)(iVar5 % 100);
  auVar7._8_8_ = in_XMM1_Qa;
  auVar7 = vfmadd132sd_fma(auVar7,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  uVar2 = (local_58._height >> 2) * 2;
  if (uVar2 < 2) {
    uVar2 = 1;
  }
  iVar5 = rand();
  iVar6 = rand();
  auVar8._0_8_ = (double)(iVar6 % 100);
  auVar8._8_8_ = in_XMM2_Qb;
  auVar8 = vfmadd132sd_fma(auVar8,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  (*Shift)(&local_80,&local_58,
           auVar7._0_8_ + ((double)(iVar4 % (int)uVar1) - (double)(local_58._width >> 2)),
           auVar8._0_8_ + ((double)(iVar5 % (int)uVar2) - (double)(local_58._height >> 2)));
  bVar3 = Unit_Test::verifyImage(&local_80,value);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  return bVar3;
}

Assistant:

bool form1_Shift(ShiftForm1 Shift)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        const double shiftX = randomFloatValue<double>( -static_cast<double>( input.width()  / 4 ), input.width() / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -static_cast<double>( input.height() / 4 ), input.height() / 4, 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        const PenguinV_Image::Image output = Shift( input, shiftX, shiftY );

        return verifyImage( output, intensity );
    }